

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall cfd::core::Serializer::CheckNeedSize(Serializer *this,uint32_t need_size)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  
  puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar3 + (-(ulong)this->offset_ - (long)puVar2) < (pointer)(ulong)need_size) {
    puVar1 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (puVar1 + (-(ulong)this->offset_ - (long)puVar2) < (pointer)(ulong)(need_size * 2)) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->buffer_,(size_type)(puVar1 + ((ulong)(need_size * 10) - (long)puVar2)));
      puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->buffer_,(size_type)(puVar3 + ((long)(ulong)(need_size * 2) - (long)puVar2)));
    return;
  }
  return;
}

Assistant:

void Serializer::CheckNeedSize(uint32_t need_size) {
  size_t size = buffer_.size() - static_cast<size_t>(offset_);
  if (size < need_size) {
    size_t cap = buffer_.capacity() - static_cast<size_t>(offset_);
    if (cap < (need_size * 2)) {
      buffer_.reserve(buffer_.capacity() + (need_size * 10));
    }
    buffer_.resize(buffer_.size() + (need_size * 2));
  }
}